

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::rayleigh_dist<long_double>::pdf
          (result_type_conflict3 *__return_storage_ptr__,rayleigh_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if ((longdouble)0 < x._0_10_) {
    in_RAX = (result_type_conflict3 *)expl();
  }
  return in_RAX;
}

Assistant:

pdf(result_type x) const {
      if (x <= 0)
        return 0;
      const result_type t{x / (P.nu() * P.nu())};
      return t * math::exp(-t * x / 2);
    }